

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsproxywidget.cpp
# Opt level: O2

void __thiscall
QGraphicsProxyWidget::resizeEvent(QGraphicsProxyWidget *this,QGraphicsSceneResizeEvent *event)

{
  long lVar1;
  long lVar2;
  bool bVar3;
  QWidget *this_00;
  long in_FS_OFFSET;
  QSizeF local_40;
  QSize local_30;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  lVar1 = *(long *)(this + 0x18);
  bVar3 = QPointer::operator_cast_to_bool((QPointer *)(lVar1 + 0x208));
  if ((bVar3) && ((*(ushort *)(lVar1 + 0x244) & 0xc) != 8)) {
    lVar2 = *(long *)(lVar1 + 0x208);
    if ((lVar2 == 0) || (*(int *)(lVar2 + 4) == 0)) {
      this_00 = (QWidget *)0x0;
    }
    else {
      this_00 = *(QWidget **)(lVar1 + 0x210);
    }
    local_40 = QGraphicsSceneResizeEvent::newSize(event);
    local_30 = QSizeF::toSize(&local_40);
    QWidget::resize(this_00,&local_30);
  }
  QGraphicsWidget::resizeEvent((QGraphicsWidget *)this,event);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QGraphicsProxyWidget::resizeEvent(QGraphicsSceneResizeEvent *event)
{
    Q_D(QGraphicsProxyWidget);
    if (d->widget) {
        if (d->sizeChangeMode != QGraphicsProxyWidgetPrivate::WidgetToProxyMode)
            d->widget->resize(event->newSize().toSize());
    }
    QGraphicsWidget::resizeEvent(event);
}